

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_history.c
# Opt level: O3

nsh_status_t nsh_history_get_entry(nsh_history_t *hist,uint age,char *entry)

{
  uint uVar1;
  uint uVar2;
  nsh_status_t nVar3;
  
  nVar3 = NSH_STATUS_WRONG_ARG;
  if (age < hist->size) {
    uVar1 = hist->head + ~age;
    uVar2 = hist->head + 0x10 + ~age;
    if (uVar1 < 0x11) {
      uVar2 = uVar1;
    }
    strncpy(entry,hist->entries[uVar2],0x80);
    nVar3 = NSH_STATUS_OK;
  }
  return nVar3;
}

Assistant:

nsh_status_t nsh_history_get_entry(nsh_history_t* hist, unsigned int age, char* entry)
{
    if (age >= nsh_history_entry_count(hist)) {
        return NSH_STATUS_WRONG_ARG;
    }

    unsigned int most_recent_entry = hist->head - 1; // head points to the element just after the most recent entry
    unsigned int entry_index = most_recent_entry - age;
    if (entry_index > NSH_CMD_HISTORY_SIZE) {
        entry_index += NSH_CMD_HISTORY_SIZE;
    }

    strncpy(entry, hist->entries[entry_index], NSH_LINE_BUFFER_SIZE);

    return NSH_STATUS_OK;
}